

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O2

void llvm::yaml::MappingTraits<llvm::DWARFYAML::PubEntry>::mapping(IO *IO,PubEntry *Entry)

{
  void *pvVar1;
  
  yaml::IO::mapRequired<llvm::yaml::Hex32>(IO,"DieOffset",&Entry->DieOffset);
  pvVar1 = yaml::IO::getContext(IO);
  if (*(char *)((long)pvVar1 + 0x1c) == '\x01') {
    yaml::IO::mapRequired<llvm::yaml::Hex8>(IO,"Descriptor",&Entry->Descriptor);
  }
  yaml::IO::mapRequired<llvm::StringRef>(IO,"Name",&Entry->Name);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::PubEntry>::mapping(IO &IO,
                                                 DWARFYAML::PubEntry &Entry) {
  IO.mapRequired("DieOffset", Entry.DieOffset);
  if (reinterpret_cast<DWARFYAML::PubSection *>(IO.getContext())->IsGNUStyle)
    IO.mapRequired("Descriptor", Entry.Descriptor);
  IO.mapRequired("Name", Entry.Name);
}